

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_maps.cpp
# Opt level: O1

int (anonymous_namespace)::
    bench<poplar::map<poplar::compact_fkhash_trie<90u,4u,poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>,poplar::standard_hash_table<80u,poplar::hash::vigna_hasher>,poplar::bijective_hash::split_mix_hasher>,poplar::compact_fkhash_nlm<int,64ul>>>
              (parser *p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer pcVar3;
  pointer pbVar4;
  uint8_t *puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  char cVar9;
  int iVar10;
  const_iterator __begin1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  uint *puVar12;
  unsigned_long *puVar13;
  int *piVar14;
  bool *pbVar15;
  FILE *pFVar16;
  map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
  *pmVar17;
  ostream *poVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  istream *piVar20;
  long lVar21;
  value_type *pvVar22;
  long lVar23;
  long lVar24;
  _Alloc_hider _Var25;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__tmp;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  long lVar26;
  size_type __n;
  double dVar27;
  string *key_1;
  pointer pbVar28;
  bool bVar29;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 extraout_var_00 [56];
  double min;
  undefined1 auVar34 [16];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  char_range key;
  char_range key_00;
  char_range key_01;
  size_t vm;
  __single_object map_1;
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  queries;
  __single_object map;
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  keys;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> query_fn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key_fn;
  string indent;
  value_type local_340;
  char local_319;
  map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
  *local_318;
  int local_30c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_308;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_300 [2];
  unsigned_long local_2f0;
  long local_2e8;
  map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
  *local_2e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_2d0 [2];
  double local_2c0;
  long local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b0;
  ulong local_2a8;
  long *local_2a0;
  long local_298;
  long local_290 [2];
  long *local_280;
  long local_278;
  long local_270 [2];
  int local_25c;
  double local_258;
  long local_250;
  double local_248;
  double local_240;
  string local_238;
  uint auStack_218 [122];
  undefined1 auVar33 [64];
  undefined1 extraout_var [56];
  
  paVar1 = &local_238.field_2;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"key_fn","");
  pbVar11 = cmdline::parser::get<std::__cxx11::string>(p,&local_238);
  local_280 = local_270;
  pcVar3 = (pbVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_280,pcVar3,pcVar3 + pbVar11->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"query_fn","");
  pbVar11 = cmdline::parser::get<std::__cxx11::string>(p,&local_238);
  local_2a0 = local_290;
  pcVar3 = (pbVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,pcVar3,pcVar3 + pbVar11->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"capa_bits","");
  puVar12 = cmdline::parser::get<unsigned_int>(p,&local_238);
  local_2a8 = (ulong)*puVar12;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"lambda","");
  puVar13 = cmdline::parser::get<unsigned_long>(p,&local_238);
  local_2f0 = *puVar13;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"runs","");
  piVar14 = cmdline::parser::get<int>(p,&local_238);
  local_2c0 = (double)(long)*piVar14;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"detail","");
  pbVar15 = cmdline::parser::get<bool>(p,&local_238);
  local_319 = *pbVar15;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  pFVar16 = fopen("/proc/self/statm","r");
  local_238._M_dataplus._M_p = (pointer)0x0;
  local_340._M_dataplus._M_p = (pointer)0x0;
  __isoc99_fscanf(pFVar16,"%ld %ld ");
  fclose(pFVar16);
  _Var25._M_p = local_340._M_dataplus._M_p;
  iVar10 = getpagesize();
  pmVar17 = (map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
             *)operator_new(0x2d8);
  poplar::
  map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
  ::map(pmVar17,(uint32_t)local_2a8,local_2f0);
  local_2e0 = pmVar17;
  std::ifstream::ifstream(&local_238,(string *)&local_280,_S_in);
  uVar2 = *(uint *)((long)auStack_218 + (long)*(double *)(local_238._M_dataplus._M_p + -0x18));
  local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var25._M_p;
  local_25c = iVar10;
  if ((uVar2 & 5) == 0) {
    local_340._M_string_length = 0;
    local_340.field_2._M_local_buf[0] = '\0';
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::reserve((ulong)&local_340);
    __n = 0;
    while( true ) {
      cVar9 = std::ios::widen(SUB81(*(double *)(local_238._M_dataplus._M_p + -0x18),0) +
                              (char)&local_238);
      piVar20 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&local_238,(string *)&local_340,cVar9);
      if (((byte)piVar20[*(long *)(*(long *)piVar20 + -0x18) + 0x20] & 5) != 0) break;
      key.end = (uint8_t *)(local_340._M_dataplus._M_p + 1 + local_340._M_string_length);
      key.begin = (uint8_t *)local_340._M_dataplus._M_p;
      pvVar22 = poplar::
                map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
                ::update(local_2e0,key);
      *pvVar22 = 1;
      __n = __n + 1;
    }
    pFVar16 = fopen("/proc/self/statm","r");
    local_2d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_308 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __isoc99_fscanf(pFVar16,"%ld %ld ");
    fclose(pFVar16);
    p_Var19 = local_308;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,
                      CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                               local_340.field_2._M_local_buf[0]) + 1);
    }
    local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)p_Var19 - (long)local_2b0);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: failed to open ",0x16);
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_280,local_278);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
    __n = 0;
  }
  std::ifstream::~ifstream(&local_238);
  local_30c = 1;
  if ((uVar2 & 5) != 0) goto LAB_001418a5;
  local_2d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  a_Stack_2d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_308 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  a_Stack_300[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::ifstream::ifstream(&local_238,(string *)&local_280,_S_in);
  uVar2 = *(uint *)((long)auStack_218 + (long)*(double *)(local_238._M_dataplus._M_p + -0x18));
  if ((uVar2 & 5) == 0) {
    p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    _Var8._M_pi = a_Stack_2d0[0]._M_pi;
    p_Var19->_M_use_count = 1;
    p_Var19->_M_weak_count = 1;
    p_Var19->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00185a38;
    local_2d8 = p_Var19 + 1;
    p_Var19[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var19[1]._M_use_count = 0;
    p_Var19[1]._M_weak_count = 0;
    p_Var19[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    bVar29 = a_Stack_2d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    a_Stack_2d0[0]._M_pi = p_Var19;
    if (bVar29) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2d8,__n);
    local_340._M_string_length = 0;
    local_340.field_2._M_local_buf[0] = '\0';
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    while( true ) {
      cVar9 = std::ios::widen(SUB81(*(double *)(local_238._M_dataplus._M_p + -0x18),0) +
                              (char)&local_238);
      piVar20 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&local_238,(string *)&local_340,cVar9);
      if (((byte)piVar20[*(long *)(*(long *)piVar20 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2d8,&local_340);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,
                      CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                               local_340.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: failed to open ",0x16);
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_280,local_278);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
  }
  std::ifstream::~ifstream(&local_238);
  local_30c = 1;
  if ((uVar2 & 5) == 0) {
    iVar10 = std::__cxx11::string::compare((char *)&local_2a0);
    if (iVar10 == 0) {
      local_308 = local_2d8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(a_Stack_300,a_Stack_2d0);
      dVar27 = local_2c0;
    }
    else {
      std::ifstream::ifstream(&local_238,(string *)&local_2a0,_S_in);
      dVar27 = local_2c0;
      uVar2 = *(uint *)((long)auStack_218 + (long)*(double *)(local_238._M_dataplus._M_p + -0x18));
      if ((uVar2 & 5) == 0) {
        p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
        _Var8._M_pi = a_Stack_300[0]._M_pi;
        p_Var19->_M_use_count = 1;
        p_Var19->_M_weak_count = 1;
        p_Var19->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00185a38;
        local_308 = p_Var19 + 1;
        p_Var19[1]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var19[1]._M_use_count = 0;
        p_Var19[1]._M_weak_count = 0;
        p_Var19[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        bVar29 = a_Stack_300[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        a_Stack_300[0]._M_pi = p_Var19;
        if (bVar29) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
        }
        local_340._M_string_length = 0;
        local_340.field_2._M_local_buf[0] = '\0';
        local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
        while( true ) {
          cVar9 = std::ios::widen(SUB81(*(double *)(local_238._M_dataplus._M_p + -0x18),0) +
                                  (char)&local_238);
          piVar20 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&local_238,(string *)&local_340,cVar9);
          if (((byte)piVar20[*(long *)(*(long *)piVar20 + -0x18) + 0x20] & 5) != 0) break;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_308,&local_340);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,
                          CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                                   local_340.field_2._M_local_buf[0]) + 1);
        }
        if ((pointer)local_308[1]._vptr__Sp_counted_base != *(pointer *)&local_308->_M_use_count) {
          std::
          __shrink_to_fit_aux<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
          ::_S_do_it((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_308);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: failed to open ",0x16);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(char *)local_2a0,local_298);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
        std::ostream::put((char)poVar18);
        std::ostream::flush();
      }
      std::ifstream::~ifstream(&local_238);
      if ((uVar2 & 5) != 0) goto LAB_0014187f;
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_238,(size_type)dVar27,
               (allocator_type *)&local_340);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_340,(size_type)dVar27,
               (allocator_type *)&local_318);
    bVar29 = 0 < SUB84(dVar27,0);
    if (SUB84(dVar27,0) < 1) {
      local_2e8 = 0;
    }
    else {
      dVar27 = 0.0;
      lVar23 = 0;
      lVar26 = 0;
      do {
        pmVar17 = (map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
                   *)operator_new(0x2d8);
        poplar::
        map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
        ::map(pmVar17,(uint32_t)local_2a8,local_2f0);
        local_318 = pmVar17;
        lVar21 = std::chrono::_V2::system_clock::now();
        pbVar4 = *(pointer *)&local_2d8->_M_use_count;
        for (pbVar28 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_2d8->_vptr__Sp_counted_base)->_M_impl).super__Vector_impl_data.
                       _M_start; pbVar28 != pbVar4; pbVar28 = pbVar28 + 1) {
          puVar5 = (uint8_t *)(pbVar28->_M_dataplus)._M_p;
          key_00.end = puVar5 + pbVar28->_M_string_length + 1;
          key_00.begin = puVar5;
          pvVar22 = poplar::
                    map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
                    ::update(local_318,key_00);
          *pvVar22 = 1;
        }
        local_2b8 = lVar23;
        lVar23 = std::chrono::_V2::system_clock::now();
        auVar34._8_8_ = in_XMM2_Qb;
        auVar34._0_8_ = in_XMM2_Qa;
        auVar34 = vcvtusi2sd_avx512f(auVar34,(long)*(pointer *)&local_2d8->_M_use_count -
                                             (long)(((
                                                  _Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_2d8->_vptr__Sp_counted_base)->_M_impl).
                                                  super__Vector_impl_data._M_start >> 5);
        *(double *)(local_238._M_dataplus._M_p + (long)dVar27 * 8) =
             ((double)(lVar23 - lVar21) / 1000.0) / auVar34._0_8_;
        lVar21 = std::chrono::_V2::system_clock::now();
        pbVar28 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_308->_vptr__Sp_counted_base)->_M_impl).super__Vector_impl_data.
                  _M_start;
        pbVar4 = *(pointer *)&local_308->_M_use_count;
        if (pbVar28 == pbVar4) {
          local_2e8 = 0;
          lVar23 = 0;
        }
        else {
          lVar23 = 0;
          local_2e8 = 0;
          do {
            puVar5 = (uint8_t *)(pbVar28->_M_dataplus)._M_p;
            key_01.end = puVar5 + pbVar28->_M_string_length + 1;
            key_01.begin = puVar5;
            pvVar22 = poplar::
                      map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
                      ::find(local_318,key_01);
            if ((pvVar22 == (value_type *)0x0) || (*pvVar22 != 1)) {
              lVar23 = lVar23 + 1;
            }
            else {
              local_2e8 = local_2e8 + 1;
            }
            pbVar28 = pbVar28 + 1;
          } while (pbVar28 != pbVar4);
        }
        lVar24 = std::chrono::_V2::system_clock::now();
        pmVar17 = local_318;
        auVar6._8_8_ = in_XMM2_Qb;
        auVar6._0_8_ = in_XMM2_Qa;
        auVar34 = vcvtusi2sd_avx512f(auVar6,(long)*(pointer *)&local_308->_M_use_count -
                                            (long)(((
                                                  _Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_308->_vptr__Sp_counted_base)->_M_impl).
                                                  super__Vector_impl_data._M_start >> 5);
        *(double *)(local_340._M_dataplus._M_p + (long)dVar27 * 8) =
             ((double)(lVar24 - lVar21) / 1000.0) / auVar34._0_8_;
        if ((dVar27 != 0.0) && ((lVar26 != local_2e8 || (local_2b8 != lVar23)))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"critical error for search results",0x21);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
          std::ostream::put(-0x38);
          std::ostream::flush();
          pmVar17 = local_318;
          if (local_318 !=
              (map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
               *)0x0) {
            poplar::compact_fkhash_nlm<int,_64UL>::~compact_fkhash_nlm(&local_318->label_store_);
            poplar::
            compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
            ::~compact_fkhash_trie(&pmVar17->hash_trie_);
            operator_delete(pmVar17,0x2d8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_340._M_dataplus._M_p,
                            CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                                     local_340.field_2._M_local_buf[0]) -
                            (long)local_340._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_238._M_dataplus._M_p,
                            local_238.field_2._M_allocated_capacity -
                            (long)local_238._M_dataplus._M_p);
          }
          goto LAB_0014187f;
        }
        if (local_318 !=
            (map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
             *)0x0) {
          poplar::compact_fkhash_nlm<int,_64UL>::~compact_fkhash_nlm(&local_318->label_store_);
          poplar::
          compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
          ::~compact_fkhash_trie(&pmVar17->hash_trie_);
          operator_delete(pmVar17,0x2d8);
        }
        dVar27 = (double)((long)dVar27 + 1);
        lVar26 = local_2e8;
      } while (dVar27 != local_2c0);
      bVar29 = (ulong)dVar27 < (ulong)local_2c0;
      dVar27 = local_2c0;
    }
    local_2c0 = 0.0;
    for (_Var25._M_p = local_238._M_dataplus._M_p;
        _Var25._M_p != (pointer)local_238._M_string_length; _Var25._M_p = _Var25._M_p + 8) {
      local_2c0 = local_2c0 + *(double *)_Var25._M_p;
    }
    local_2b8 = local_238._M_string_length - (long)local_238._M_dataplus._M_p;
    auVar34 = ZEXT816(0x7fefffffffffffff);
    local_240 = 1.79769313486232e+308;
    _Var25._M_p = local_238._M_dataplus._M_p;
    if (local_2b8 != 0) {
      do {
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(double *)_Var25._M_p;
        auVar34 = vminsd_avx(auVar30,auVar34);
        local_240 = auVar34._0_8_;
        _Var25._M_p = _Var25._M_p + 8;
      } while (_Var25._M_p != (pointer)local_238._M_string_length);
    }
    local_248 = 0.0;
    for (_Var25._M_p = local_340._M_dataplus._M_p;
        _Var25._M_p != (pointer)local_340._M_string_length; _Var25._M_p = _Var25._M_p + 8) {
      local_248 = local_248 + *(double *)_Var25._M_p;
    }
    local_250 = local_340._M_string_length - (long)local_340._M_dataplus._M_p;
    auVar34 = ZEXT816(0x7fefffffffffffff);
    local_258 = 1.79769313486232e+308;
    _Var25._M_p = local_340._M_dataplus._M_p;
    if (local_250 != 0) {
      do {
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(double *)_Var25._M_p;
        auVar34 = vminsd_avx(auVar31,auVar34);
        local_258 = auVar34._0_8_;
        _Var25._M_p = _Var25._M_p + 8;
      } while (_Var25._M_p != (pointer)local_340._M_string_length);
    }
    local_2f0 = (long)*(pointer *)&local_308->_M_use_count -
                (long)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_308->_vptr__Sp_counted_base)->_M_impl).super__Vector_impl_data.
                      _M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_340._M_dataplus._M_p,
                      CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                               local_340.field_2._M_local_buf[0]) - (long)local_340._M_dataplus._M_p
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_238._M_dataplus._M_p,
                      local_238.field_2._M_allocated_capacity - (long)local_238._M_dataplus._M_p);
    }
    if (!bVar29) {
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      auVar32._0_8_ = std::__cxx11::string::_M_construct((ulong)&local_238,'\0');
      auVar32._8_56_ = extraout_var;
      auVar34 = auVar32._0_16_;
      poplar::
      short_realname<poplar::map<poplar::compact_fkhash_trie<90u,4u,poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>,poplar::standard_hash_table<80u,poplar::hash::vigna_hasher>,poplar::bijective_hash::split_mix_hasher>,poplar::compact_fkhash_nlm<int,64ul>>>
                ();
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"map_name",8);
      local_318._0_1_ = (allocator_type)0x3a;
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_318,1);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,local_340._M_dataplus._M_p,local_340._M_string_length);
      local_318 = (map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
                   *)CONCAT71(local_318._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_318,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,
                        CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                                 local_340.field_2._M_local_buf[0]) + 1);
      }
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"key_fn",6);
      local_340._M_dataplus._M_p._0_1_ = 0x3a;
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)local_280,local_278);
      local_340._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"query_fn",8);
      local_340._M_dataplus._M_p._0_1_ = 0x3a;
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)local_2a0,local_298);
      local_340._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"init_capa_bits",0xe);
      local_340._M_dataplus._M_p._0_1_ = 0x3a;
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
      local_340._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"rss_bytes",9);
      local_340._M_dataplus._M_p._0_1_ = 0x3a;
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      lVar26 = (long)local_2b0 * (long)local_25c;
      poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
      local_340._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"rss_MiB",7);
      local_340._M_dataplus._M_p._0_1_ = 0x3a;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      auVar34 = vcvtusi2sd_avx512f(auVar34,lVar26);
      poVar18 = std::ostream::_M_insert<double>(auVar34._0_8_ * 9.5367431640625e-07);
      local_340._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"num_keys",8);
      local_340._M_dataplus._M_p._0_1_ = 0x3a;
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
      local_340._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"num_queries",0xb);
      local_340._M_dataplus._M_p._0_1_ = 0x3a;
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
      local_340._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"runs",4);
      local_340._M_dataplus._M_p._0_1_ = 0x3a;
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = (ostream *)std::ostream::operator<<((ostream *)poVar18,SUB84(dVar27,0));
      auVar33._8_56_ = extraout_var_00;
      auVar33._0_8_ = extraout_XMM0_Qa;
      auVar34 = auVar33._0_16_;
      local_340._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"insert_us_per_key",0x11);
      local_340._M_dataplus._M_p._0_1_ = 0x3a;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      auVar34 = vcvtusi2sd_avx512f(auVar34,local_2b8 >> 3);
      poVar18 = std::ostream::_M_insert<double>(local_2c0 / auVar34._0_8_);
      local_340._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"best_insert_us_per_key",0x16);
      local_340._M_dataplus._M_p._0_1_ = 0x3a;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::ostream::_M_insert<double>(local_240);
      local_340._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"search_us_per_query",0x13);
      local_340._M_dataplus._M_p._0_1_ = 0x3a;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      auVar7._8_8_ = in_XMM2_Qb;
      auVar7._0_8_ = in_XMM2_Qa;
      auVar34 = vcvtusi2sd_avx512f(auVar7,local_250 >> 3);
      poVar18 = std::ostream::_M_insert<double>(local_248 / auVar34._0_8_);
      local_340._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"best_search_us_per_query",0x18);
      local_340._M_dataplus._M_p._0_1_ = 0x3a;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::ostream::_M_insert<double>(local_258);
      local_340._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"ok",2);
      local_340._M_dataplus._M_p._0_1_ = 0x3a;
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
      local_340._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"ng",2);
      local_340._M_dataplus._M_p._0_1_ = 0x3a;
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
      local_340._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_340,1);
      if (local_319 != '\0') {
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                             local_238._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"map",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,":\n",2);
        poplar::
        map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
        ::show_stats(local_2e0,(ostream *)&std::cout,1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      local_30c = 0;
    }
  }
LAB_0014187f:
  if (a_Stack_300[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_300[0]._M_pi);
  }
  if (a_Stack_2d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_2d0[0]._M_pi);
  }
LAB_001418a5:
  pmVar17 = local_2e0;
  if (local_2e0 !=
      (map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
       *)0x0) {
    poplar::compact_fkhash_nlm<int,_64UL>::~compact_fkhash_nlm(&local_2e0->label_store_);
    poplar::
    compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
    ::~compact_fkhash_trie(&pmVar17->hash_trie_);
    operator_delete(pmVar17,0x2d8);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0,local_290[0] + 1);
  }
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  return local_30c;
}

Assistant:

int bench(const cmdline::parser& p) {
    auto key_fn = p.get<std::string>("key_fn");
    auto query_fn = p.get<std::string>("query_fn");
    auto capa_bits = p.get<uint32_t>("capa_bits");
    auto lambda = p.get<uint64_t>("lambda");
    auto runs = p.get<int>("runs");
    auto detail = p.get<bool>("detail");

    uint64_t num_keys = 0, num_queries = 0;
    uint64_t ok = 0, ng = 0;
    uint64_t process_size = get_process_size();

    double insert_us_per_key = 0.0, search_us_per_query = 0.0;
    double best_insert_us_per_key = 0.0, best_search_us_per_query = 0.0;

    auto map = std::make_unique<Map>(capa_bits, lambda);
    {
        std::ifstream ifs{key_fn};
        if (!ifs) {
            std::cerr << "error: failed to open " << key_fn << std::endl;
            return 1;
        }

        std::string key;
        key.reserve(1024);

        while (std::getline(ifs, key)) {
            *map->update(key) = 1;
            ++num_keys;
        }
        process_size = get_process_size() - process_size;
    }

    std::shared_ptr<std::vector<std::string>> keys;
    std::shared_ptr<std::vector<std::string>> queries;

    {
        std::ifstream ifs{key_fn};
        if (!ifs) {
            std::cerr << "Error: failed to open " << key_fn << std::endl;
            return 1;
        }

        keys = std::make_shared<std::vector<std::string>>();
        keys->reserve(num_keys);

        for (std::string line; std::getline(ifs, line);) {
            keys->push_back(line);
        }
    }

    if (query_fn != "-") {
        std::ifstream ifs{query_fn};
        if (!ifs) {
            std::cerr << "Error: failed to open " << query_fn << std::endl;
            return 1;
        }

        queries = std::make_shared<std::vector<std::string>>();

        for (std::string line; std::getline(ifs, line);) {
            queries->push_back(line);
        }
        queries->shrink_to_fit();
    } else {
        queries = keys;
    }

    {
        std::vector<double> insert_times(runs);
        std::vector<double> search_times(runs);

        for (int i = 0; i < runs; ++i) {
            auto map = std::make_unique<Map>(capa_bits, lambda);

            // insertion
            {
                timer t;
                for (const std::string& key : *keys) {
                    *map->update(key) = 1;
                }
                insert_times[i] = t.get<std::micro>() / keys->size();
            }

            // retrieval
            size_t _ok = 0, _ng = 0;
            {
                timer t;
                for (const std::string& query : *queries) {
                    auto ptr = map->find(query);
                    if (ptr != nullptr and *ptr == 1) {
                        ++_ok;
                    } else {
                        ++_ng;
                    }
                }
                search_times[i] = t.get<std::micro>() / queries->size();
            }

            if (i != 0) {
                if ((ok != _ok) or (ng != _ng)) {
                    std::cerr << "critical error for search results" << std::endl;
                    return 1;
                }
            }

            ok = _ok;
            ng = _ng;
        }

        num_keys = keys->size();
        num_queries = queries->size();
        insert_us_per_key = get_average(insert_times);
        best_insert_us_per_key = get_min(insert_times);
        search_us_per_query = get_average(search_times);
        best_search_us_per_query = get_min(search_times);
    }

    std::ostream& out = std::cout;
    auto indent = get_indent(0);

    show_stat(out, indent, "map_name", short_realname<Map>());
    show_stat(out, indent, "key_fn", key_fn);
    show_stat(out, indent, "query_fn", query_fn);
    show_stat(out, indent, "init_capa_bits", capa_bits);

    show_stat(out, indent, "rss_bytes", process_size);
    show_stat(out, indent, "rss_MiB", process_size / (1024.0 * 1024.0));

    show_stat(out, indent, "num_keys", num_keys);
    show_stat(out, indent, "num_queries", num_queries);

    show_stat(out, indent, "runs", runs);
    show_stat(out, indent, "insert_us_per_key", insert_us_per_key);
    show_stat(out, indent, "best_insert_us_per_key", best_insert_us_per_key);
    show_stat(out, indent, "search_us_per_query", search_us_per_query);
    show_stat(out, indent, "best_search_us_per_query", best_search_us_per_query);

    show_stat(out, indent, "ok", ok);
    show_stat(out, indent, "ng", ng);

    if (detail) {
        show_member(out, indent, "map");
        map->show_stats(out, 1);
    }

    return 0;
}